

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

shared_ptr<OpticsParser::ProductGeometry> __thiscall
OpticsParser::parsePerforatedGeometry(OpticsParser *this,json *geometry_json)

{
  undefined8 dimensionY_00;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar1;
  PerforatedGeometry *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  double spacingX_00;
  double spacingY_00;
  double dimensionX_00;
  shared_ptr<OpticsParser::ProductGeometry> sVar2;
  string local_88;
  undefined1 local_58 [8];
  string perforationType;
  double dimensionY;
  double dimensionX;
  double spacingY;
  double spacingX;
  json *geometry_json_local;
  
  pbVar1 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::at<const_char_(&)[10],_0>(geometry_json,(char (*) [10])"spacing_x");
  spacingX_00 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::get<double,double>(pbVar1);
  pbVar1 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::at<const_char_(&)[10],_0>(geometry_json,(char (*) [10])"spacing_y");
  spacingY_00 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::get<double,double>(pbVar1);
  pbVar1 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::at<const_char_(&)[12],_0>(geometry_json,(char (*) [12])"dimension_x");
  dimensionX_00 =
       nlohmann::json_abi_v3_11_3::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       ::get<double,double>(pbVar1);
  pbVar1 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::at<const_char_(&)[12],_0>(geometry_json,(char (*) [12])"dimension_y");
  perforationType.field_2._8_8_ =
       nlohmann::json_abi_v3_11_3::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       ::get<double,double>(pbVar1);
  pbVar1 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::at<const_char_(&)[17],_0>(geometry_json,(char (*) [17])"perforation_type");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::get<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,pbVar1);
  this_00 = (PerforatedGeometry *)operator_new(0x48);
  dimensionY_00 = perforationType.field_2._8_8_;
  std::__cxx11::string::string
            ((string *)&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  PerforatedGeometry::PerforatedGeometry
            (this_00,spacingX_00,spacingY_00,dimensionX_00,(double)dimensionY_00,&local_88);
  std::shared_ptr<OpticsParser::ProductGeometry>::shared_ptr<OpticsParser::PerforatedGeometry,void>
            ((shared_ptr<OpticsParser::ProductGeometry> *)this,this_00);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)local_58);
  sVar2.super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<OpticsParser::ProductGeometry>)
         sVar2.super___shared_ptr<OpticsParser::ProductGeometry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ProductGeometry> parsePerforatedGeometry(nlohmann::json const & geometry_json)
    {
        double spacingX = geometry_json.at("spacing_x").get<double>();
        double spacingY = geometry_json.at("spacing_y").get<double>();
        double dimensionX = geometry_json.at("dimension_x").get<double>();
        double dimensionY = geometry_json.at("dimension_y").get<double>();
        std::string perforationType = geometry_json.at("perforation_type").get<std::string>();

        return std::shared_ptr<ProductGeometry>(
          new PerforatedGeometry(spacingX, spacingY, dimensionX, dimensionY, perforationType));
    }